

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O0

void tlstran_pipe_fini(void *arg)

{
  tlstran_pipe *p;
  void *arg_local;
  
  tlstran_pipe_stop(arg);
  nng_stream_free(*arg);
  nni_aio_fini((nni_aio *)((long)arg + 0x268));
  nni_aio_fini((nni_aio *)((long)arg + 0xa0));
  nni_aio_fini((nni_aio *)((long)arg + 0x430));
  nni_msg_free(*(nni_msg **)((long)arg + 0x5f8));
  nni_mtx_fini((nni_mtx *)((long)arg + 0x600));
  return;
}

Assistant:

static void
tlstran_pipe_fini(void *arg)
{
	tlstran_pipe *p = arg;

	tlstran_pipe_stop(p);
	nng_stream_free(p->tls);
	nni_aio_fini(&p->rxaio);
	nni_aio_fini(&p->txaio);
	nni_aio_fini(&p->negoaio);
	nni_msg_free(p->rxmsg);
	nni_mtx_fini(&p->mtx);
}